

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_550beb::ObjCProtoName::isObjCObject(ObjCProtoName *this)

{
  Node *pNVar1;
  _func_int **__s1;
  int iVar2;
  
  pNVar1 = this->Ty;
  if (pNVar1->K == KNameType) {
    __s1 = pNVar1[1]._vptr_Node;
    if ((long)*(_func_int ***)&pNVar1[1].K - (long)__s1 == 0xb) {
      if (*(_func_int ***)&pNVar1[1].K != __s1) {
        iVar2 = bcmp(__s1,"objc_object",0xb);
        return iVar2 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool isObjCObject() const {
    return Ty->getKind() == KNameType &&
           static_cast<NameType *>(Ty)->getName() == "objc_object";
  }